

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

int archive_read_set_callback_data2(archive *_a,void *client_data,uint iindex)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_set_callback_data2");
  if (iVar1 == -0x1e) {
    return -0x1e;
  }
  if (_a[1].current_codepage == 0) {
    pcVar2 = (char *)calloc(1,0x18);
    _a[1].read_data_block = pcVar2;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "No memory.";
      iVar1 = 0xc;
      goto LAB_00227f04;
    }
    _a[1].current_codepage = 1;
  }
  if (iindex <= _a[1].current_codepage - 1) {
    pcVar2 = _a[1].read_data_block;
    *(void **)(pcVar2 + (ulong)iindex * 0x18 + 0x10) = client_data;
    pcVar2 = pcVar2 + (ulong)iindex * 0x18;
    pcVar2[0] = -1;
    pcVar2[1] = -1;
    pcVar2[2] = -1;
    pcVar2[3] = -1;
    pcVar2[4] = -1;
    pcVar2[5] = -1;
    pcVar2[6] = -1;
    pcVar2[7] = -1;
    pcVar2[8] = -1;
    pcVar2[9] = -1;
    pcVar2[10] = -1;
    pcVar2[0xb] = -1;
    pcVar2[0xc] = -1;
    pcVar2[0xd] = -1;
    pcVar2[0xe] = -1;
    pcVar2[0xf] = -1;
    return 0;
  }
  pcVar2 = "Invalid index specified.";
  iVar1 = 0x16;
LAB_00227f04:
  archive_set_error(_a,iVar1,pcVar2);
  return -0x1e;
}

Assistant:

int
archive_read_set_callback_data2(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_set_callback_data2");

	if (a->client.nodes == 0)
	{
		a->client.dataset = (struct archive_read_data_node *)
		    calloc(1, sizeof(*a->client.dataset));
		if (a->client.dataset == NULL)
		{
			archive_set_error(&a->archive, ENOMEM,
				"No memory.");
			return ARCHIVE_FATAL;
		}
		a->client.nodes = 1;
	}

	if (iindex > a->client.nodes - 1)
	{
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}